

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t format_function_key(char *buf,Terminal *term,wchar_t key_number,_Bool shift,_Bool ctrl,
                           _Bool alt,_Bool *consumed_alt)

{
  uint uVar1;
  wchar_t wVar2;
  uint uVar3;
  wchar_t wVar4;
  ulong uVar5;
  char *pcVar6;
  wchar_t wVar7;
  bool bVar8;
  
  if (key_number < L'\x01') {
    __assert_fail("key_number > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1cfb,
                  "int format_function_key(char *, Terminal *, int, _Bool, _Bool, _Bool, _Bool *)");
  }
  if (0x14 < (uint)key_number) {
    __assert_fail("key_number < lenof(key_number_to_tilde_code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                  ,0x1cfc,
                  "int format_function_key(char *, Terminal *, int, _Bool, _Bool, _Bool, _Bool *)");
  }
  wVar2 = term->funky_type;
  if ((uint)(wVar2 + L'\xfffffffb') < 2) {
    if (wVar2 == L'\x05') {
      uVar1 = key_number + L'\xffffffff';
      if (0xc < (uint)key_number) {
        uVar1 = 0;
      }
      uVar3 = uVar1 + 0xc;
      if (!shift) {
        uVar3 = uVar1;
      }
      uVar1 = uVar3 + 0x18;
      if (!ctrl) {
        uVar1 = uVar3;
      }
      wVar4 = (wchar_t)"MNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz@[\\]^_`{"[uVar1];
      pcVar6 = "\x1b[%c";
      goto LAB_0010eac5;
    }
  }
  else {
    bVar8 = (uint)key_number < 0xb;
    wVar4 = key_number + L'\n';
    if (!bVar8 || !shift) {
      wVar4 = key_number;
    }
    key_number = wVar4;
    shift = (bVar8 && shift) != shift;
  }
  uVar5 = (ulong)(uint)key_number;
  wVar4 = format_function_key::key_number_to_tilde_code[uVar5];
  if (term->vt52_mode == false) {
    if ((wVar2 != L'\x04') || (0xc < (uint)key_number)) {
      if ((wVar2 == L'\x01') && ((uint)key_number < 6)) {
        wVar4 = wVar4 + L'6';
        pcVar6 = "\x1b[[%c";
        goto LAB_0010eac5;
      }
      goto LAB_0010ea67;
    }
    pcVar6 = "\x1bO%c";
  }
  else {
    if (0xc < (uint)key_number) {
LAB_0010ea67:
      if ((wVar2 | 4U) == 6) {
        if ((uint)key_number < 5) {
          if (term->vt52_mode == false) {
            if ((wVar2 == L'\x06') &&
               (wVar2 = shift_bitmap(shift,ctrl,alt,consumed_alt), wVar2 != L'\0')) {
              wVar7 = wVar4 + L'E';
              pcVar6 = "\x1b[1;%d%c";
              wVar4 = wVar2;
              goto LAB_0010eb02;
            }
            wVar4 = wVar4 + L'E';
            pcVar6 = "\x1bO%c";
          }
          else {
            wVar4 = wVar4 + L'E';
            pcVar6 = "\x1b%c";
          }
          goto LAB_0010eac5;
        }
        if ((wVar2 == L'\x06') &&
           (wVar7 = shift_bitmap(shift,ctrl,alt,consumed_alt), wVar7 != L'\0')) {
          pcVar6 = "\x1b[%d;%d~";
LAB_0010eb02:
          wVar2 = sprintf(buf,pcVar6,(ulong)(uint)wVar4,(ulong)(uint)wVar7);
          return wVar2;
        }
      }
      pcVar6 = "\x1b[%d~";
      goto LAB_0010eac5;
    }
    pcVar6 = "\x1b%c";
  }
  uVar3 = (uint)(uVar5 - 6 < 0xf);
  uVar1 = ~uVar3;
  if (9 < uVar5 - 0xb) {
    uVar1 = -uVar3;
  }
  wVar4 = wVar4 + uVar1 + L'E';
LAB_0010eac5:
  wVar2 = sprintf(buf,pcVar6,(ulong)(uint)wVar4);
  return wVar2;
}

Assistant:

int format_function_key(char *buf, Terminal *term, int key_number,
                        bool shift, bool ctrl, bool alt, bool *consumed_alt)
{
    char *p = buf;

    static const int key_number_to_tilde_code[] = {
        -1,                 /* no such key as F0 */
        11, 12, 13, 14, 15, /*gap*/ 17, 18, 19, 20, 21, /*gap*/
        23, 24, 25, 26, /*gap*/ 28, 29, /*gap*/ 31, 32, 33, 34,
    };

    assert(key_number > 0);
    assert(key_number < lenof(key_number_to_tilde_code));

    int index = key_number;
    if (term->funky_type != FUNKY_XTERM_216 && term->funky_type != FUNKY_SCO) {
        if (shift && index <= 10) {
            shift = false;
            index += 10;
        }
    }

    int code = key_number_to_tilde_code[index];

    if (term->funky_type == FUNKY_SCO) {
        /* SCO function keys */
        static const char sco_codes[] =
            "MNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz@[\\]^_`{";
        index = (key_number >= 1 && key_number <= 12) ? key_number - 1 : 0;
        if (shift) index += 12;
        if (ctrl) index += 24;
        p += sprintf(p, "\x1B[%c", sco_codes[index]);
    } else if ((term->vt52_mode || term->funky_type == FUNKY_VT100P) &&
               code >= 11 && code <= 24) {
        int offt = 0;
        if (code > 15)
            offt++;
        if (code > 21)
            offt++;
        if (term->vt52_mode)
            p += sprintf(p, "\x1B%c", code + 'P' - 11 - offt);
        else
            p += sprintf(p, "\x1BO%c", code + 'P' - 11 - offt);
    } else if (term->funky_type == FUNKY_LINUX && code >= 11 && code <= 15) {
        p += sprintf(p, "\x1B[[%c", code + 'A' - 11);
    } else if ((term->funky_type == FUNKY_XTERM ||
                term->funky_type == FUNKY_XTERM_216) &&
               code >= 11 && code <= 14) {
        if (term->vt52_mode)
            p += sprintf(p, "\x1B%c", code + 'P' - 11);
        else {
            int bitmap = 0;
            if (term->funky_type == FUNKY_XTERM_216)
                bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
            if (bitmap)
                p += sprintf(p, "\x1B[1;%d%c", bitmap, code + 'P' - 11);
            else
                p += sprintf(p, "\x1BO%c", code + 'P' - 11);
        }
    } else {
        int bitmap = 0;
        if (term->funky_type == FUNKY_XTERM_216)
            bitmap = shift_bitmap(shift, ctrl, alt, consumed_alt);
        if (bitmap)
            p += sprintf(p, "\x1B[%d;%d~", code, bitmap);
        else
            p += sprintf(p, "\x1B[%d~", code);
    }

    return p - buf;
}